

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

BPropEntry * narrow_bpc_get(jit_State *J,IRRef1 key,IRRef mode)

{
  BPropEntry *pBVar1;
  BPropEntry *bp;
  ptrdiff_t i;
  IRRef mode_local;
  IRRef1 key_local;
  jit_State *J_local;
  
  bp = (BPropEntry *)0x0;
  while( true ) {
    if (0xf < (long)bp) {
      return (BPropEntry *)0x0;
    }
    pBVar1 = J->bpropcache + (long)bp;
    if (((pBVar1->key == key) && (mode <= pBVar1->mode)) && (((pBVar1->mode ^ mode) & 0xfff) == 0))
    break;
    bp = (BPropEntry *)((long)&bp->key + 1);
  }
  return pBVar1;
}

Assistant:

static BPropEntry *narrow_bpc_get(jit_State *J, IRRef1 key, IRRef mode)
{
  ptrdiff_t i;
  for (i = 0; i < BPROP_SLOTS; i++) {
    BPropEntry *bp = &J->bpropcache[i];
    /* Stronger checks are ok, too. */
    if (bp->key == key && bp->mode >= mode &&
	((bp->mode ^ mode) & IRCONV_MODEMASK) == 0)
      return bp;
  }
  return NULL;
}